

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O0

size_t __thiscall absl::lts_20240722::cord_internal::RefcountAndFlags::Get(RefcountAndFlags *this)

{
  RefcountAndFlags *this_local;
  memory_order __b;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  return (long)((this->count_).super___atomic_base<int>._M_i >> 1);
}

Assistant:

inline size_t Get() const {
    return static_cast<size_t>(count_.load(std::memory_order_acquire) >>
                               kNumFlags);
  }